

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColPivHouseholderQR.h
# Opt level: O2

void __thiscall
Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
_solve_impl<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>>
          (ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>> *this,
          Matrix<float,__1,__1,_0,__1,__1> *rhs,Matrix<float,__1,_1,_0,__1,_1> *dst)

{
  XprTypeNested cRows;
  XprTypeNested pMVar1;
  XprTypeNested i_00;
  Index i;
  PlainObject c;
  DenseStorage<float,__1,__1,__1,_0> local_100;
  undefined1 local_e8 [24];
  variable_if_dynamic<long,__1> vStack_d0;
  variable_if_dynamic<long,__1> local_c8;
  variable_if_dynamic<long,__1> vStack_c0;
  Index local_b8;
  undefined1 local_a8 [16];
  variable_if_dynamic<long,__1> local_98;
  XprTypeNested pMStack_90;
  variable_if_dynamic<long,__1> local_88;
  variable_if_dynamic<long,__1> vStack_80;
  Index local_78;
  Type local_68;
  
  cRows = (XprTypeNested)
          ColPivHouseholderQR<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::nonzeroPivots
                    ((ColPivHouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)this);
  if (cRows != (XprTypeNested)0x0) {
    DenseStorage<float,_-1,_-1,_-1,_0>::DenseStorage
              (&local_100,(DenseStorage<float,__1,__1,__1,_0> *)rhs);
    ColPivHouseholderQR<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::householderQ
              ((HouseholderSequenceType *)local_e8,
               (ColPivHouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)this);
    local_a8._0_8_ = local_e8._0_8_;
    local_a8._8_8_ = local_e8._8_8_;
    local_98.m_value = CONCAT71(local_98.m_value._1_7_,local_e8[0x10]) ^ 1;
    local_88.m_value = local_c8.m_value;
    vStack_d0.m_value = (long)cRows;
    pMStack_90 = cRows;
    MatrixBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    applyOnTheLeft<Eigen::HouseholderSequence<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,1>>
              ((MatrixBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_100,
               (EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1>_>
                *)local_a8);
    DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::topLeftCorner<long,long>
              ((Type *)local_e8,this,(long)cRows,(long)cRows);
    local_78 = local_b8;
    local_88.m_value = local_c8.m_value;
    vStack_80.m_value = vStack_c0.m_value;
    pMStack_90 = (XprTypeNested)vStack_d0.m_value;
    local_a8._0_8_ = local_e8._0_8_;
    local_a8._8_8_ = local_e8._8_8_;
    DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::topRows<long>
              (&local_68,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&local_100,
               (long)cRows);
    TriangularViewImpl<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,-1,false>const,2u,Eigen::Dense>
    ::solveInPlace<1,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>>
              ((TriangularViewImpl<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,false>const,2u,Eigen::Dense>
                *)local_a8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
               &local_68);
    i_00 = (XprTypeNested)0x0;
    pMVar1 = cRows;
    if ((long)cRows < 1) {
      pMVar1 = i_00;
    }
    for (; pMVar1 != i_00;
        i_00 = (XprTypeNested)
               ((long)&(i_00->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                       m_storage.m_data + 1)) {
      Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_a8,
                 (Matrix<float,__1,__1,_0,__1,__1> *)&local_100,(Index)i_00);
      Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1,_1,_false>::Block
                ((Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false> *)local_e8,dst,
                 (long)*(int *)(*(long *)(this + 0x28) + (long)i_00 * 4));
      internal::
      call_assignment<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,1,1,false>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,1,_1,false>>
                ((Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false> *)local_e8,
                 (Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_a8);
    }
    for (; (long)cRows < *(long *)(this + 0x10);
        cRows = (XprTypeNested)
                ((long)&(cRows->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                        m_storage.m_data + 1)) {
      Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1,_1,_false>::Block
                ((Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false> *)local_a8,dst,
                 (long)*(int *)(*(long *)(this + 0x28) + (long)cRows * 4));
      DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1,_1,_false>_>::setZero
                ((DenseBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false>_> *)
                 local_a8);
    }
    free(local_100.m_data);
    return;
  }
  DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)dst);
  return;
}

Assistant:

void ColPivHouseholderQR<_MatrixType>::_solve_impl(const RhsType &rhs, DstType &dst) const
{
  const Index nonzero_pivots = nonzeroPivots();

  if(nonzero_pivots == 0)
  {
    dst.setZero();
    return;
  }

  typename RhsType::PlainObject c(rhs);

  c.applyOnTheLeft(householderQ().setLength(nonzero_pivots).adjoint() );

  m_qr.topLeftCorner(nonzero_pivots, nonzero_pivots)
      .template triangularView<Upper>()
      .solveInPlace(c.topRows(nonzero_pivots));

  for(Index i = 0; i < nonzero_pivots; ++i) dst.row(m_colsPermutation.indices().coeff(i)) = c.row(i);
  for(Index i = nonzero_pivots; i < cols(); ++i) dst.row(m_colsPermutation.indices().coeff(i)).setZero();
}